

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Pack_external
              (char *datarep,void *inbuf,int incount,MPIABI_Datatype datatype,void *outbuf,
              MPIABI_Aint outsize,MPIABI_Aint *position)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  WPI_Handle<ompi_datatype_t_*> local_40;
  MPIABI_Aint local_38;
  MPIABI_Aint outsize_local;
  void *outbuf_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_18;
  int incount_local;
  void *inbuf_local;
  char *datarep_local;
  
  local_38 = outsize;
  outsize_local = (MPIABI_Aint)outbuf;
  outbuf_local = (void *)datatype;
  datatype_local._4_4_ = incount;
  pvStack_18 = inbuf;
  inbuf_local = datarep;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  iVar1 = MPI_Pack_external(datarep,inbuf,incount,poVar2,outsize_local,local_38,position);
  return iVar1;
}

Assistant:

int MPIABI_Pack_external(
  const char * datarep,
  const void * inbuf,
  int incount,
  MPIABI_Datatype datatype,
  void * outbuf,
  MPIABI_Aint outsize,
  MPIABI_Aint * position
) {
  return MPI_Pack_external(
    datarep,
    inbuf,
    incount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    outbuf,
    (MPI_Aint)(WPI_Aint)outsize,
    (MPI_Aint *)(WPI_Aint *)position
  );
}